

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Cluster::~Cluster(Cluster *this)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long in_RDI;
  BlockEntry *p;
  BlockEntry **j;
  BlockEntry **i;
  long *local_10;
  
  if (*(long *)(in_RDI + 0x40) < 1) {
    if (*(void **)(in_RDI + 0x30) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x30));
    }
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x30);
    lVar2 = *(long *)(in_RDI + 0x40);
    local_10 = *(long **)(in_RDI + 0x30);
    while (local_10 != (long *)(lVar1 + lVar2 * 8)) {
      plVar4 = local_10 + 1;
      plVar3 = (long *)*local_10;
      local_10 = plVar4;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    if (*(void **)(in_RDI + 0x30) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x30));
    }
  }
  return;
}

Assistant:

Cluster::~Cluster() {
  if (m_entries_count <= 0) {
    delete[] m_entries;
    return;
  }

  BlockEntry** i = m_entries;
  BlockEntry** const j = m_entries + m_entries_count;

  while (i != j) {
    BlockEntry* p = *i++;
    assert(p);

    delete p;
  }

  delete[] m_entries;
}